

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FIReader.cpp
# Opt level: O3

string * __thiscall Assimp::FIBase64ValueImpl::toString_abi_cxx11_(FIBase64ValueImpl *this)

{
  byte bVar1;
  int iVar2;
  ostream *poVar3;
  long lVar4;
  byte bVar5;
  long lVar6;
  ostringstream os;
  string local_1c8;
  undefined7 uStack_1c7;
  long local_1b8 [2];
  ostringstream local_1a8 [112];
  ios_base local_138 [264];
  
  if (this->strValueValid == false) {
    this->strValueValid = true;
    std::__cxx11::ostringstream::ostringstream(local_1a8);
    lVar6 = (long)(this->super_FIBase64Value).super_FIByteValue.value.
                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                  super__Vector_impl_data._M_finish -
            (long)(this->super_FIBase64Value).super_FIByteValue.value.
                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                  super__Vector_impl_data._M_start;
    if (lVar6 != 0) {
      lVar4 = 0;
      iVar2 = 0;
      bVar5 = 0;
      do {
        bVar1 = (this->super_FIBase64Value).super_FIByteValue.value.
                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_start[lVar4];
        if (iVar2 == 2) {
          local_1c8 = *(string *)
                       ("ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/" +
                       (ulong)(bVar1 >> 6) + (ulong)(bVar5 & 0xf) * 4);
          poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)local_1a8,(char *)&local_1c8,1);
          local_1c8 = *(string *)
                       ("ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/" +
                       (bVar1 & 0x3f));
          std::__ostream_insert<char,std::char_traits<char>>(poVar3,(char *)&local_1c8,1);
          iVar2 = 0;
        }
        else if (iVar2 == 1) {
          local_1c8 = *(string *)
                       ("ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/" +
                       (byte)(bVar1 >> 4 | (bVar5 & 3) << 4));
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_1a8,(char *)&local_1c8,1);
          iVar2 = 2;
        }
        else {
          local_1c8 = *(string *)
                       ("ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/" +
                       (bVar1 >> 2));
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_1a8,(char *)&local_1c8,1);
          iVar2 = 1;
        }
        lVar4 = lVar4 + 1;
        bVar5 = bVar1;
      } while (lVar6 + (ulong)(lVar6 == 0) != lVar4);
      if (iVar2 == 1) {
        local_1c8 = *(string *)
                     ("ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/" +
                     ((byte)(bVar1 << 4) & 0x30));
        poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)local_1a8,(char *)&local_1c8,1);
        std::__ostream_insert<char,std::char_traits<char>>(poVar3,"==",2);
      }
      else if (iVar2 == 2) {
        local_1c8 = *(string *)
                     ("ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/" +
                     ((uint)bVar1 * 4 & 0x3c));
        poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)local_1a8,(char *)&local_1c8,1);
        local_1c8 = (string)0x3d;
        std::__ostream_insert<char,std::char_traits<char>>(poVar3,(char *)&local_1c8,1);
      }
    }
    std::__cxx11::stringbuf::str();
    std::__cxx11::string::operator=((string *)&this->strValue,&local_1c8);
    if ((long *)CONCAT71(uStack_1c7,local_1c8) != local_1b8) {
      operator_delete((long *)CONCAT71(uStack_1c7,local_1c8),local_1b8[0] + 1);
    }
    std::__cxx11::ostringstream::~ostringstream(local_1a8);
    std::ios_base::~ios_base(local_138);
  }
  return &this->strValue;
}

Assistant:

virtual const std::string &toString() const /*override*/ {
        if (!strValueValid) {
            strValueValid = true;
            std::ostringstream os;
            uint8_t c1 = 0, c2;
            int imod3 = 0;
            std::vector<uint8_t>::size_type valueSize = value.size();
            for (std::vector<uint8_t>::size_type i = 0; i < valueSize; ++i) {
                c2 = value[i];
                switch (imod3) {
                case 0:
                    os << basis_64[c2 >> 2];
                    imod3 = 1;
                    break;
                case 1:
                    os << basis_64[((c1 & 0x03) << 4) | ((c2 & 0xf0) >> 4)];
                    imod3 = 2;
                    break;
                case 2:
                    os << basis_64[((c1 & 0x0f) << 2) | ((c2 & 0xc0) >> 6)] << basis_64[c2 & 0x3f];
                    imod3 = 0;
                    break;
                }
                c1 = c2;
            }
            switch (imod3) {
            case 1:
                os << basis_64[(c1 & 0x03) << 4] << "==";
                break;
            case 2:
                os << basis_64[(c1 & 0x0f) << 2] << '=';
                break;
            }
            strValue = os.str();
        }
        return strValue;
    }